

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O0

void duckdb::DecodeSortKeyStruct
               (DecodeSortKeyData *decode_data,DecodeSortKeyVectorData *vector_data,Vector *result,
               idx_t result_idx)

{
  char cVar1;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  *this;
  size_type sVar2;
  char *in_RSI;
  Vector *in_RDI;
  value_type *child_entry;
  idx_t c;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *child_entries;
  DecodeSortKeyData *in_stack_00000030;
  data_t validity_byte;
  Vector *in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb0;
  ulong local_38;
  
  cVar1 = *(char *)((long)&((in_RDI->type).type_info_.internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->_vptr_ExtraTypeInfo + *(long *)in_RDI);
  (in_RDI->type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((long)&((in_RDI->type).type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_ExtraTypeInfo + 1);
  if (cVar1 == *in_RSI) {
    FlatVector::Validity((Vector *)0x13e8bdc);
    TemplatedValidityMask<unsigned_long>::SetInvalid
              ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffffb0,
               (idx_t)in_stack_ffffffffffffffa8);
  }
  this = &StructVector::GetEntries(in_stack_ffffffffffffffa8)->
          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ;
  local_38 = 0;
  while( true ) {
    sVar2 = ::std::
            vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ::size(this);
    if (sVar2 <= local_38) break;
    vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>::
    operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                *)in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffa8 = in_RDI;
    in_stack_ffffffffffffffb0 =
         vector<duckdb::DecodeSortKeyVectorData,_true>::operator[]
                   ((vector<duckdb::DecodeSortKeyVectorData,_true> *)in_stack_ffffffffffffffb0,
                    (size_type)in_RDI);
    unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
              ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
               in_stack_ffffffffffffffb0);
    DecodeSortKeyRecursive
              (in_stack_00000030,(DecodeSortKeyVectorData *)child_entries,(Vector *)c,
               (idx_t)child_entry);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void DecodeSortKeyStruct(DecodeSortKeyData &decode_data, DecodeSortKeyVectorData &vector_data, Vector &result,
                         idx_t result_idx) {
	// check if the top-level is valid or not
	auto validity_byte = decode_data.data[decode_data.position];
	decode_data.position++;
	if (validity_byte == vector_data.null_byte) {
		// entire struct is NULL
		// note that we still deserialize the children
		FlatVector::Validity(result).SetInvalid(result_idx);
	}
	// recurse into children
	auto &child_entries = StructVector::GetEntries(result);
	for (idx_t c = 0; c < child_entries.size(); c++) {
		auto &child_entry = child_entries[c];
		DecodeSortKeyRecursive(decode_data, vector_data.child_data[c], *child_entry, result_idx);
	}
}